

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredmesh.cc
# Opt level: O3

void __thiscall gvr::ColoredMesh::loadPLY(ColoredMesh *this,PLYReader *ply)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t *psVar3;
  size_t *psVar4;
  bool bVar5;
  ply_type pVar6;
  ply_type pVar7;
  ply_type pVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  float _scale;
  UInt8Receiver cg;
  UInt8Receiver cr;
  FloatArrayReceiver ss;
  FloatArrayReceiver ny;
  FloatArrayReceiver nx;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver se;
  FloatArrayReceiver vx;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  TriangleReceiver tr;
  UInt8Receiver cb;
  FloatArrayReceiver nz;
  FloatArrayReceiver sz;
  FloatArrayReceiver sc;
  string local_3e8;
  string local_3c8;
  UInt8Receiver local_3a8;
  UInt8Receiver local_388;
  FloatArrayReceiver local_368;
  FloatArrayReceiver local_348;
  FloatArrayReceiver local_328;
  FloatArrayReceiver local_308;
  FloatArrayReceiver local_2e8;
  FloatArrayReceiver local_2c8;
  FloatArrayReceiver local_2a8;
  FloatArrayReceiver local_288;
  FloatArrayReceiver local_268;
  long local_248;
  PLYReceiver local_240;
  ColoredMesh *local_238;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  UInt8Receiver local_b0;
  FloatArrayReceiver local_90;
  FloatArrayReceiver local_70;
  FloatArrayReceiver local_50;
  
  psVar3 = &local_2a8.size;
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"vertex","");
  lVar9 = PLYReader::instancesOfElement(ply,(string *)&local_2a8);
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  Model::setOriginFromPLY((Model *)this,ply);
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"vertex","");
  local_268.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_268.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"scan_size","");
  pVar6 = PLYReader::getTypeOfProperty(ply,(string *)&local_2a8,(string *)&local_268);
  uVar10 = 1;
  local_248 = lVar9;
  if (pVar6 == ply_none) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"vertex","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"scan_error","");
    pVar7 = PLYReader::getTypeOfProperty(ply,&local_d0,&local_f0);
    if (pVar7 != ply_none) goto LAB_0012bce2;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"vertex","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"scan_conf","");
    pVar7 = PLYReader::getTypeOfProperty(ply,&local_1d0,&local_110);
    uVar10 = (ulong)(pVar7 != ply_none);
    bVar11 = true;
  }
  else {
LAB_0012bce2:
    bVar11 = false;
  }
  local_288.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_288.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"vertex","");
  local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_368.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"sx","");
  pVar7 = PLYReader::getTypeOfProperty(ply,(string *)&local_288,(string *)&local_368);
  if (pVar7 != ply_none) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"vertex","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"sy","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_130,&local_150);
    if (pVar8 != ply_none) {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"vertex","");
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"sz","");
      PLYReader::getTypeOfProperty(ply,&local_1f0,&local_170);
      bVar5 = true;
      goto LAB_0012be3b;
    }
  }
  bVar5 = false;
LAB_0012be3b:
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(this,local_248,uVar10);
  psVar3 = &local_368.size;
  if (bVar5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
  }
  if (pVar7 != ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_288.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_288.size) {
    operator_delete(local_288.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (bVar11) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
  }
  if (pVar6 == ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (local_268.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_268.size) {
    operator_delete(local_268.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_2a8.size) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_2a8,(this->super_Mesh).super_PointCloud.vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_268,(this->super_Mesh).super_PointCloud.vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_288,(this->super_Mesh).super_PointCloud.vertex,3,2);
  local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"vertex","");
  psVar4 = &local_2c8.size;
  local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"x","");
  PLYReader::setReceiver(ply,(string *)&local_368,(string *)&local_2c8,&local_2a8.super_PLYReceiver)
  ;
  if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"vertex","");
  local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"y","");
  PLYReader::setReceiver(ply,(string *)&local_368,(string *)&local_2c8,&local_268.super_PLYReceiver)
  ;
  if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"vertex","");
  local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"z","");
  PLYReader::setReceiver(ply,(string *)&local_368,(string *)&local_2c8,&local_288.super_PLYReceiver)
  ;
  if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_368,(this->super_Mesh).super_PointCloud.scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_2c8,(this->super_Mesh).super_PointCloud.scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_50,(this->super_Mesh).super_PointCloud.scanprop,3,2)
  ;
  if ((this->super_Mesh).super_PointCloud.scanprop != (float *)0x0) {
    psVar3 = &local_2e8.size;
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"vertex","");
    psVar4 = &local_308.size;
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"scan_size","");
    PLYReader::setReceiver
              (ply,(string *)&local_2e8,(string *)&local_308,&local_368.super_PLYReceiver);
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"vertex","");
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"scan_error","");
    PLYReader::setReceiver
              (ply,(string *)&local_2e8,(string *)&local_308,&local_2c8.super_PLYReceiver);
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"vertex","");
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"scan_conf","");
    PLYReader::setReceiver
              (ply,(string *)&local_2e8,(string *)&local_308,&local_50.super_PLYReceiver);
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_2e8,(this->super_Mesh).super_PointCloud.scanpos,3,0)
  ;
  FloatArrayReceiver::FloatArrayReceiver(&local_308,(this->super_Mesh).super_PointCloud.scanpos,3,1)
  ;
  FloatArrayReceiver::FloatArrayReceiver(&local_70,(this->super_Mesh).super_PointCloud.scanpos,3,2);
  if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    psVar3 = &local_328.size;
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"vertex","");
    psVar4 = &local_348.size;
    local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"sx","");
    PLYReader::setReceiver
              (ply,(string *)&local_328,(string *)&local_348,&local_2e8.super_PLYReceiver);
    if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"vertex","");
    local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"sy","");
    PLYReader::setReceiver
              (ply,(string *)&local_328,(string *)&local_348,&local_308.super_PLYReceiver);
    if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"vertex","");
    local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"sz","");
    PLYReader::setReceiver
              (ply,(string *)&local_328,(string *)&local_348,&local_70.super_PLYReceiver);
    if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_328,(this->super_Mesh).normal,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_348,(this->super_Mesh).normal,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_90,(this->super_Mesh).normal,3,2);
  psVar4 = &local_388.offset;
  local_388.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"vertex","");
  psVar3 = &local_3a8.offset;
  local_3a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"nx","");
  PLYReader::setReceiver(ply,(string *)&local_388,(string *)&local_3a8,&local_328.super_PLYReceiver)
  ;
  if (local_3a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_3a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_388.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"vertex","");
  local_3a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"ny","");
  PLYReader::setReceiver(ply,(string *)&local_388,(string *)&local_3a8,&local_348.super_PLYReceiver)
  ;
  if (local_3a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_3a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_388.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"vertex","");
  local_3a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"nz","");
  PLYReader::setReceiver(ply,(string *)&local_388,(string *)&local_3a8,&local_90.super_PLYReceiver);
  if (local_3a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_3a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_388.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"vertex","");
  local_3a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"diffuse_red","");
  pVar6 = PLYReader::getTypeOfProperty(ply,(string *)&local_388,(string *)&local_3a8);
  if (local_3a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_3a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (pVar6 == ply_none) {
    local_388.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"vertex","");
    local_3a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"red","");
    pVar6 = PLYReader::getTypeOfProperty(ply,(string *)&local_388,(string *)&local_3a8);
    if (local_3a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_3a8.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (pVar6 == ply_none) {
      local_388.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"vertex","");
      local_3a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"r","");
      pVar6 = PLYReader::getTypeOfProperty(ply,(string *)&local_388,(string *)&local_3a8);
      if (local_3a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
        operator_delete(local_3a8.super_PLYReceiver._vptr_PLYReceiver);
      }
      if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
        operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
      }
    }
  }
  if (pVar6 - ply_float32 < 2) {
    _scale = 255.0;
  }
  else {
    _scale = *(float *)(&DAT_00162ecc + (ulong)(pVar6 == ply_uint16) * 4);
  }
  UInt8Receiver::UInt8Receiver(&local_388,this->rgb,0,_scale);
  UInt8Receiver::UInt8Receiver(&local_3a8,this->rgb,1,_scale);
  UInt8Receiver::UInt8Receiver(&local_b0,this->rgb,2,_scale);
  paVar1 = &local_3e8.field_2;
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"vertex","");
  paVar2 = &local_3c8.field_2;
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"diffuse_red","");
  PLYReader::setReceiver(ply,&local_3e8,&local_3c8,&local_388.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"vertex","");
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"diffuse_green","");
  PLYReader::setReceiver(ply,&local_3e8,&local_3c8,&local_3a8.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"vertex","");
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"diffuse_blue","");
  PLYReader::setReceiver(ply,&local_3e8,&local_3c8,&local_b0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"vertex","");
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"red","");
  PLYReader::setReceiver(ply,&local_3e8,&local_3c8,&local_388.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"vertex","");
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"green","");
  PLYReader::setReceiver(ply,&local_3e8,&local_3c8,&local_3a8.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"vertex","");
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"blue","");
  PLYReader::setReceiver(ply,&local_3e8,&local_3c8,&local_b0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"vertex","");
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"r","");
  PLYReader::setReceiver(ply,&local_3e8,&local_3c8,&local_388.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"vertex","");
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"g","");
  PLYReader::setReceiver(ply,&local_3e8,&local_3c8,&local_3a8.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"vertex","");
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"b","");
  PLYReader::setReceiver(ply,&local_3e8,&local_3c8,&local_b0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"face","");
  uVar10 = PLYReader::instancesOfElement(ply,&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])(this,uVar10 & 0xffffffff);
  local_240._vptr_PLYReceiver = (_func_int **)&PTR_setValue_00177240;
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  local_238 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"face","");
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"vertex_index","");
  PLYReader::setReceiver(ply,&local_3e8,&local_3c8,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"face","");
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"vertex_indices","");
  PLYReader::setReceiver(ply,&local_3e8,&local_3c8,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  PLYReader::readData(ply);
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"vertex","");
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"nx","");
  pVar6 = PLYReader::getTypeOfProperty(ply,&local_3e8,&local_3c8);
  if (pVar6 == ply_none) {
    bVar11 = true;
  }
  else {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vertex","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"ny","");
    pVar6 = PLYReader::getTypeOfProperty(ply,&local_210,&local_190);
    if (pVar6 == ply_none) {
      bVar11 = true;
    }
    else {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"vertex","");
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"nz","");
      pVar6 = PLYReader::getTypeOfProperty(ply,&local_230,&local_1b0);
      bVar11 = pVar6 == ply_none;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  if (bVar11) {
    Mesh::recalculateNormals(&this->super_Mesh);
  }
  else {
    Mesh::normalizeNormals(&this->super_Mesh);
  }
  return;
}

Assistant:

void ColoredMesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  float scale=1.0f;
  ply_type type=ply.getTypeOfProperty("vertex", "diffuse_red");

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "red");
  }

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "r");
  }

  if (type == ply_uint16)
  {
    scale=1.0f/256;
  }

  if (type == ply_float32 || type == ply_float64)
  {
    scale=255;
  }

  UInt8Receiver cr(getColorArray(), 0, scale), cg(getColorArray(), 1, scale), cb(getColorArray(), 2,
      scale);

  ply.setReceiver("vertex", "diffuse_red", &cr);
  ply.setReceiver("vertex", "diffuse_green", &cg);
  ply.setReceiver("vertex", "diffuse_blue", &cb);

  ply.setReceiver("vertex", "red", &cr);
  ply.setReceiver("vertex", "green", &cg);
  ply.setReceiver("vertex", "blue", &cb);

  ply.setReceiver("vertex", "r", &cr);
  ply.setReceiver("vertex", "g", &cg);
  ply.setReceiver("vertex", "b", &cb);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}